

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

void ExUtilDeleteCommandLineArguments(CommandLineArguments *args)

{
  char **in_RDI;
  
  if (in_RDI != (char **)0x0) {
    if (*(int *)(in_RDI + 4) != 0) {
      WebPFree((void *)0x105ea3);
      WebPDataClear((WebPData *)0x105eb0);
    }
    ResetCommandLineArguments(args._4_4_,in_RDI,(CommandLineArguments *)0x105ebf);
  }
  return;
}

Assistant:

void ExUtilDeleteCommandLineArguments(CommandLineArguments* const args) {
  if (args != NULL) {
    if (args->own_argv_) {
      WebPFree((void*)args->argv_);
      WebPDataClear(&args->argv_data_);
    }
    ResetCommandLineArguments(0, NULL, args);
  }
}